

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasthessian.cpp
# Opt level: O0

void compute_response_layer(response_layer *layer,integral_image *iimage)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int *in_RDI;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  int unaff_retaddr;
  int unaff_retaddr_00;
  int in_stack_00000008;
  int in_stack_0000000c;
  integral_image *in_stack_00000010;
  int j;
  int ind;
  int i;
  float inv_area;
  int border;
  int lobe;
  int width;
  int height;
  int filter_size;
  int step;
  bool *laplacian;
  float *response;
  int y;
  int x;
  float Dxy;
  float Dyy;
  float Dxx;
  int local_60;
  int local_5c;
  int local_58;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  lVar3 = *(long *)(in_RDI + 4);
  lVar4 = *(long *)(in_RDI + 6);
  iVar1 = in_RDI[2];
  iVar2 = in_RDI[1];
  fVar8 = 1.0 / (float)(*in_RDI * *in_RDI);
  local_5c = 0;
  for (local_58 = 0; local_58 < iVar1; local_58 = local_58 + 1) {
    for (local_60 = 0; local_60 < iVar2; local_60 = local_60 + 1) {
      fVar9 = box_integral(in_stack_00000010,in_stack_0000000c,in_stack_00000008,unaff_retaddr_00,
                           unaff_retaddr);
      auVar14._0_4_ =
           box_integral(in_stack_00000010,in_stack_0000000c,in_stack_00000008,unaff_retaddr_00,
                        unaff_retaddr);
      auVar14._4_60_ = extraout_var;
      auVar6 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),auVar14._0_16_,ZEXT416((uint)fVar9));
      fVar9 = box_integral(in_stack_00000010,in_stack_0000000c,in_stack_00000008,unaff_retaddr_00,
                           unaff_retaddr);
      auVar15._0_4_ =
           box_integral(in_stack_00000010,in_stack_0000000c,in_stack_00000008,unaff_retaddr_00,
                        unaff_retaddr);
      auVar15._4_60_ = extraout_var_00;
      auVar7 = vfmadd213ss_fma(ZEXT416(0xc0400000),auVar15._0_16_,ZEXT416((uint)fVar9));
      fVar10 = box_integral(in_stack_00000010,in_stack_0000000c,in_stack_00000008,unaff_retaddr_00,
                            unaff_retaddr);
      fVar11 = box_integral(in_stack_00000010,in_stack_0000000c,in_stack_00000008,unaff_retaddr_00,
                            unaff_retaddr);
      fVar12 = box_integral(in_stack_00000010,in_stack_0000000c,in_stack_00000008,unaff_retaddr_00,
                            unaff_retaddr);
      fVar13 = box_integral(in_stack_00000010,in_stack_0000000c,in_stack_00000008,unaff_retaddr_00,
                            unaff_retaddr);
      fVar9 = auVar6._0_4_ * fVar8;
      fVar5 = auVar7._0_4_ * fVar8;
      fVar10 = (((fVar10 + fVar11) - fVar12) - fVar13) * fVar8;
      auVar6 = vfmsub213ss_fma(ZEXT416((uint)fVar5),ZEXT416((uint)fVar9),
                               ZEXT416((uint)(fVar10 * 0.81 * fVar10)));
      *(int *)(lVar3 + (long)local_5c * 4) = auVar6._0_4_;
      *(byte *)(lVar4 + local_5c) = (fVar9 + fVar5 < 0.0) - 1U & 1;
      local_5c = local_5c + 1;
    }
  }
  return;
}

Assistant:

void compute_response_layer(struct response_layer* layer, struct integral_image* iimage) {
    float Dxx, Dyy, Dxy;
    int x, y;

    float* response = layer->response;
    bool* laplacian = layer->laplacian;

    int step = layer->step;
    int filter_size = layer->filter_size;
    int height = layer->height;
    int width = layer->width;

    int lobe = filter_size/3;
    int border = (filter_size-1)/2;
    float inv_area = 1.f/(filter_size*filter_size);

    for (int i = 0, ind = 0; i < height; ++i) {
        for (int j = 0; j < width; ++j, ind++) {
            // Image coordinates
            x = i*step;
            y = j*step;

            // Calculate Dxx, Dyy, Dxy with Box Filter
            Dxx = box_integral(iimage, x - lobe + 1, y - border, 2*lobe - 1, filter_size)
                    - 3 * box_integral(iimage, x - lobe + 1, y - lobe / 2, 2*lobe - 1, lobe);
            Dyy = box_integral(iimage, x - border, y - lobe + 1, filter_size, 2*lobe - 1)
                    - 3 * box_integral(iimage, x - lobe / 2, y - lobe + 1, lobe, 2*lobe - 1);
            Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe)
                    + box_integral(iimage, x + 1, y - lobe, lobe, lobe)
                    - box_integral(iimage, x - lobe, y - lobe, lobe, lobe)
                    - box_integral(iimage, x + 1, y + 1, lobe, lobe);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dyy *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = (Dxx + Dyy >= 0 ? true : false);
        }
    }

}